

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O0

IVec2 __thiscall
deqp::gles2::Functional::sequenceSideEffCase2(Functional *this,bool in0,bool in1,Vec2 *in2)

{
  Vector<float,_2> local_40;
  Vector<float,_2> local_38;
  Vector<float,_2> local_30;
  tcu local_28 [8];
  Vec2 *local_20;
  Vec2 *in2_local;
  bool in1_local;
  Functional *pFStack_10;
  bool in0_local;
  
  local_20 = in2;
  in2_local._6_1_ = in1;
  in2_local._7_1_ = in0;
  pFStack_10 = this;
  tcu::Vector<float,_2>::Vector(&local_38,1.0);
  tcu::operator+((tcu *)&local_30,in2,&local_38);
  tcu::Vector<float,_2>::Vector(&local_40,(float)(in2_local._7_1_ & 1));
  tcu::operator+(local_28,&local_30,&local_40);
  tcu::Vector<float,_2>::asInt((Vector<float,_2> *)this);
  return (IVec2)(int  [2])this;
}

Assistant:

inline IVec2	sequenceSideEffCase2 (bool in0, bool in1, const Vec2& in2)						{ DE_UNREF(in1); return (in2 + Vec2(1.0f) + Vec2((float)in0)).asInt(); }